

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

int lys_features_change(lys_module *module,char *name,int op)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  lys_feature *plVar4;
  int iVar5;
  lys_module *plVar6;
  LY_ERR *pLVar7;
  long lVar8;
  char *pcVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  lys_feature *plVar13;
  ulong uVar14;
  bool bVar15;
  int local_54;
  uint local_3c;
  int local_38;
  int local_34;
  
  uVar11 = 1;
  if ((name != (char *)0x0 && module != (lys_module *)0x0) && (*name != '\0')) {
    bVar15 = true;
    if (*name == '*') {
      bVar15 = name[1] != '\0';
    }
    local_34 = 1;
    uVar14 = 1;
    while ((local_34 != 0 && ((int)uVar14 != 0))) {
      local_34 = 0;
      local_3c = 0;
      lVar10 = -1;
      while (lVar8 = lVar10, lVar8 < (long)(ulong)module->inc_size) {
        plVar6 = module;
        if (lVar8 + 1 != 0) {
          plVar6 = (lys_module *)module->inc[lVar8].submodule;
        }
        plVar4 = plVar6->features;
        bVar2 = plVar6->features_size;
        for (uVar14 = 0; lVar10 = lVar8 + 1, uVar14 != bVar2; uVar14 = uVar14 + 1) {
          if ((bVar15 == false) || (iVar5 = strcmp(plVar4[uVar14].name,name), iVar5 == 0)) {
            if (op == 0) {
              if ((plVar4[uVar14].flags >> 8 & 1) != 0) {
                lys_features_disable_recursive(plVar4 + uVar14);
                local_34 = local_34 + 1;
              }
            }
            else if ((plVar4[uVar14].flags >> 8 & 1) == 0) {
              plVar13 = plVar4 + uVar14;
              lVar10 = 0;
              uVar12 = 0;
              while( true ) {
                bVar3 = plVar13->iffeature_size;
                uVar11 = (uint)uVar12;
                if (bVar3 <= uVar12) break;
                iVar5 = resolve_iffeature((lys_iffeature *)
                                          ((long)&plVar13->iffeature->expr + lVar10));
                if (iVar5 == 0) {
                  if (bVar15 != false) {
                    pLVar7 = ly_errno_location();
                    *pLVar7 = LY_EINVAL;
                    pcVar9 = plVar13->name;
                    uVar14 = (ulong)(uVar11 + 1);
                    goto LAB_00153ab3;
                  }
                  local_3c = uVar11 + 1;
                  bVar3 = plVar13->iffeature_size;
                  local_54 = (int)lVar8;
                  local_38 = (int)uVar14;
                  break;
                }
                uVar12 = uVar12 + 1;
                lVar10 = lVar10 + 0x20;
              }
              if (uVar11 == bVar3) {
                pbVar1 = (byte *)((long)&plVar13->flags + 1);
                *pbVar1 = *pbVar1 | 1;
                local_34 = local_34 + 1;
              }
            }
            if (bVar15 != false) {
              return 0;
            }
          }
        }
      }
      uVar14 = (ulong)local_3c;
    }
    if ((int)uVar14 == 0) {
      uVar11 = (uint)bVar15;
    }
    else {
      pLVar7 = ly_errno_location();
      *pLVar7 = LY_EINVAL;
      if (local_54 != -1) {
        module = (lys_module *)module->inc[local_54].submodule;
      }
      pcVar9 = module->features[local_38].name;
LAB_00153ab3:
      ly_log(LY_LLERR,"Feature \"%s\" is disabled by its %d. if-feature condition.",pcVar9,uVar14);
      uVar11 = 1;
    }
  }
  return uVar11;
}

Assistant:

static int
lys_features_change(const struct lys_module *module, const char *name, int op)
{
    int all = 0;
    int i, j, k;
    int progress, faili, failj, failk;

    uint8_t fsize;
    struct lys_feature *f;

    if (!module || !name || !strlen(name)) {
        return EXIT_FAILURE;
    }

    if (!strcmp(name, "*")) {
        /* enable all */
        all = 1;
    }

    progress = failk = 1;
    while (progress && failk) {
        for (i = -1, failk = progress = 0; i < module->inc_size; i++) {
            if (i == -1) {
                fsize = module->features_size;
                f = module->features;
            } else {
                fsize = module->inc[i].submodule->features_size;
                f = module->inc[i].submodule->features;
            }

            for (j = 0; j < fsize; j++) {
                if (all || !strcmp(f[j].name, name)) {
                    if ((op && (f[j].flags & LYS_FENABLED)) || (!op && !(f[j].flags & LYS_FENABLED))) {
                        if (all) {
                            /* skip already set features */
                            continue;
                        } else {
                            /* feature already set correctly */
                            return EXIT_SUCCESS;
                        }
                    }

                    if (op) {
                        /* check referenced features if they are enabled */
                        for (k = 0; k < f[j].iffeature_size; k++) {
                            if (!resolve_iffeature(&f[j].iffeature[k])) {
                                if (all) {
                                    faili = i;
                                    failj = j;
                                    failk = k + 1;
                                    break;
                                } else {
                                    LOGERR(LY_EINVAL, "Feature \"%s\" is disabled by its %d. if-feature condition.",
                                           f[j].name, k + 1);
                                    return EXIT_FAILURE;
                                }
                            }
                        }

                        if (k == f[j].iffeature_size) {
                            /* the last check passed, do the change */
                            f[j].flags |= LYS_FENABLED;
                            progress++;
                        }
                    } else {
                        lys_features_disable_recursive(&f[j]);
                        progress++;
                    }
                    if (!all) {
                        /* stop in case changing a single feature */
                        return EXIT_SUCCESS;
                    }
                }
            }
        }
    }
    if (failk) {
        /* print info about the last failing feature */
        LOGERR(LY_EINVAL, "Feature \"%s\" is disabled by its %d. if-feature condition.",
               faili == -1 ? module->features[failj].name : module->inc[faili].submodule->features[failj].name, failk);
        return EXIT_FAILURE;
    }

    if (all) {
        return EXIT_SUCCESS;
    } else {
        /* the specified feature not found */
        return EXIT_FAILURE;
    }
}